

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O1

int __thiscall IsoWriter::allocateEntity(IsoWriter *this,FileEntryInfo *entity,int sectorNum)

{
  FileTypes FVar1;
  int iVar2;
  int iVar3;
  pointer ppFVar4;
  int iVar5;
  ulong in_RAX;
  mapped_type *pmVar6;
  mapped_type mVar7;
  FileEntryInfo **i;
  pointer ppFVar8;
  undefined8 uStack_38;
  
  FVar1 = entity->m_fileType;
  if (FVar1 != Directory) {
    if ((FVar1 != RealtimeFile) && (FVar1 != File)) goto LAB_00191800;
    if (entity->m_objectId != '\0') {
      this->m_totalFiles = this->m_totalFiles + 1;
      goto LAB_00191800;
    }
    if (FVar1 != Directory) goto LAB_00191800;
  }
  this->m_totalDirectories = this->m_totalDirectories + 1;
LAB_00191800:
  uStack_38 = in_RAX;
  iVar5 = FileEntryInfo::allocateEntity(entity,sectorNum);
  if (entity->m_objectId != '\0') {
    iVar2 = entity->m_parent->m_sectorNum;
    iVar3 = entity->m_sectorNum;
    uStack_38 = (ulong)CONCAT14(entity->m_objectId,(undefined4)uStack_38);
    pmVar6 = std::
             map<int,_MappingEntry,_std::less<int>,_std::allocator<std::pair<const_int,_MappingEntry>_>_>
             ::operator[](&this->m_mappingEntries,(key_type_conflict *)((long)&uStack_38 + 4));
    mVar7.LBN = iVar3;
    mVar7.parentLBN = iVar2;
    *pmVar6 = mVar7;
  }
  iVar5 = iVar5 + sectorNum;
  ppFVar4 = (entity->m_files).super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar8 = (entity->m_files).
                 super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppFVar8 != ppFVar4; ppFVar8 = ppFVar8 + 1) {
    iVar5 = allocateEntity(this,*ppFVar8,iVar5);
  }
  ppFVar4 = (entity->m_subDirs).
            super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppFVar8 = (entity->m_subDirs).
                 super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppFVar8 != ppFVar4; ppFVar8 = ppFVar8 + 1) {
    iVar5 = allocateEntity(this,*ppFVar8,iVar5);
  }
  return iVar5;
}

Assistant:

int IsoWriter::allocateEntity(FileEntryInfo *entity, int sectorNum)
{
    if ((entity->m_fileType == FileTypes::File || entity->m_fileType == FileTypes::RealtimeFile) && entity->m_objectId)
        m_totalFiles++;
    else if (entity->m_fileType == FileTypes::Directory)
        m_totalDirectories++;

    sectorNum += entity->allocateEntity(sectorNum);
    if (entity->m_objectId)
        m_mappingEntries[entity->m_objectId] = MappingEntry(entity->m_parent->m_sectorNum, entity->m_sectorNum);

    for (const auto &i : entity->m_files) sectorNum = allocateEntity(i, sectorNum);
    for (const auto &i : entity->m_subDirs) sectorNum = allocateEntity(i, sectorNum);
    return sectorNum;
}